

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureLog.cxx
# Opt level: O0

void __thiscall cmConfigureLog::~cmConfigureLog(cmConfigureLog *this)

{
  cmConfigureLog *this_local;
  
  if ((this->Opened & 1U) != 0) {
    EndObject(this);
    std::operator<<(&(this->Stream).super_basic_ostream<char,_std::char_traits<char>_>,"...\n");
  }
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&this->Encoder);
  std::ofstream::~ofstream(&this->Stream);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->LogVersions);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

cmConfigureLog::~cmConfigureLog()
{
  if (this->Opened) {
    this->EndObject();
    this->Stream << "...\n";
  }
}